

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Table.cpp
# Opt level: O2

ostream * __thiscall Table::print_table(Table *this,ostream *outs)

{
  pointer pbVar1;
  long lVar2;
  BPlusTree<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
  *other;
  Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
  *pPVar3;
  reference pvVar4;
  uint uVar5;
  ulong __n;
  int iVar6;
  size_t j;
  ulong uVar7;
  long lVar8;
  pointer pbVar9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  row;
  Iterator it;
  MultiMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
  sorted;
  Record r;
  fstream file_stream;
  size_t __nbytes;
  
  std::fstream::fstream(&file_stream);
  get_filename_abi_cxx11_((string *)&r,this);
  bin_io::open_fileRW(&file_stream,(char *)r._0_8_);
  std::__cxx11::string::~string((string *)&r);
  lVar8 = *(long *)outs;
  *(undefined8 *)(outs + *(long *)(lVar8 + -0x18) + 0x10) = 8;
  lVar8 = *(long *)(lVar8 + -0x18);
  *(uint *)(outs + lVar8 + 0x18) = *(uint *)(outs + lVar8 + 0x18) & 0xffffff4f | 0x20;
  std::operator<<(outs,"Num");
  pbVar1 = (this->columns).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar9 = (this->columns).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar9 != pbVar1; pbVar9 = pbVar9 + 1) {
    std::__cxx11::string::string((string *)&r,(string *)pbVar9);
    lVar8 = *(long *)outs;
    *(undefined8 *)(outs + *(long *)(lVar8 + -0x18) + 0x10) = 0x14;
    lVar8 = *(long *)(lVar8 + -0x18);
    *(uint *)(outs + lVar8 + 0x18) = *(uint *)(outs + lVar8 + 0x18) & 0xffffff4f | 0x20;
    std::operator<<(outs,(string *)&r);
    std::__cxx11::string::~string((string *)&r);
  }
  std::operator<<(outs,'\n');
  r._0_8_ = r.buffer[0] + 0xc;
  std::__cxx11::string::_M_construct
            ((ulong)&r,
             (char)((long)(this->columns).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->columns).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5) * '\x14');
  std::operator<<(outs,(string *)&r);
  std::__cxx11::string::~string((string *)&r);
  std::operator<<(outs,'\n');
  Record::Record(&r);
  other = &Index::operator[](&this->index,
                             (this->columns).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->tree;
  BPlusTree<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
  ::BPlusTree(&sorted.tree,other);
  it.tree_iter = BPlusTree<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
                 ::begin(&sorted.tree);
  iVar6 = 1;
  while (it.tree_iter.node_ptr !=
         (BPlusTree<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
          *)0x0) {
    __n = 0;
    while( true ) {
      pPVar3 = BPlusTree<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
               ::Iterator::operator->(&it.tree_iter);
      if ((ulong)((long)(pPVar3->values).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(pPVar3->values).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3) <= __n) break;
      lVar8 = *(long *)outs;
      *(undefined8 *)(outs + *(long *)(lVar8 + -0x18) + 0x10) = 8;
      lVar8 = *(long *)(lVar8 + -0x18);
      uVar5 = *(uint *)(outs + lVar8 + 0x18) & 0xffffff4f | 0x20;
      __nbytes = (size_t)uVar5;
      *(uint *)(outs + lVar8 + 0x18) = uVar5;
      std::ostream::operator<<((ostream *)outs,iVar6);
      pPVar3 = BPlusTree<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
               ::Iterator::operator->(&it.tree_iter);
      pvVar4 = std::vector<long,_std::allocator<long>_>::at(&pPVar3->values,__n);
      Record::read(&r,(int)&file_stream,(void *)*pvVar4,__nbytes);
      Record::to_vector_abi_cxx11_(&row,&r);
      lVar8 = 0;
      for (uVar7 = 0;
          uVar7 < (ulong)((long)row.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)row.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 5); uVar7 = uVar7 + 1)
      {
        lVar2 = *(long *)outs;
        *(undefined8 *)(outs + *(long *)(lVar2 + -0x18) + 0x10) = 0x14;
        lVar2 = *(long *)(lVar2 + -0x18);
        *(uint *)(outs + lVar2 + 0x18) = *(uint *)(outs + lVar2 + 0x18) & 0xffffff4f | 0x20;
        std::operator<<(outs,(string *)
                             ((long)&((row.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p
                             + lVar8));
        lVar8 = lVar8 + 0x20;
      }
      std::operator<<(outs,'\n');
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&row);
      __n = __n + 1;
      iVar6 = iVar6 + 1;
    }
    MultiMap::
    MultiMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>
    ::Iterator::operator++((Iterator *)&it.tree_iter);
  }
  std::fstream::close();
  BPlusTree<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>
  ::~BPlusTree(&sorted.tree);
  std::fstream::~fstream(&file_stream);
  return outs;
}

Assistant:

std::ostream& Table::print_table(std::ostream& outs) {
    const int NUM_WIDTH = 8;
    std::fstream file_stream;
    bin_io::open_fileRW(file_stream, get_filename().c_str());
    outs << std::setw(NUM_WIDTH) << std::left << "Num";
    for (auto e : columns) {
        outs << std::setw(constants::MAX_BLOCK_COLS) << std::left;
        outs << e;
    }
    outs << '\n';
    outs << std::string(columns.size() * constants::MAX_BLOCK_COLS, '-');
    outs << '\n';

    Record r;
    // sort by first column
    MultiMap::MultiMap<std::string, long> sorted = index[columns[0]];
    int num = 1;
    for (auto it = sorted.begin(); it != nullptr; ++it) {
        for (size_t i = 0; i < it->size(); ++i, ++num) {
            outs << std::setw(NUM_WIDTH) << std::left << num;
            r.read(file_stream, it->at(i));
            auto row = r.to_vector();
            for (size_t j = 0; j < row.size(); ++j) {
                outs << std::setw(constants::MAX_BLOCK_COLS) << std::left;
                outs << row[j];
            }
            outs << '\n';
        }
    }
    file_stream.close();
    return outs;
}